

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O2

void __thiscall settings_tests::Simple::test_method(Simple *this)

{
  vector<UniValue,std::allocator<UniValue>> *pvVar1;
  mapped_type *pmVar2;
  mapped_type *this_00;
  long in_FS_OFFSET;
  Settings settings2;
  Settings settings;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  key_type local_1d8;
  undefined1 local_1b8 [32];
  _Base_ptr local_198;
  size_t local_190;
  _Rb_tree_node_base local_180;
  size_t local_160;
  _Rb_tree_node_base local_150;
  size_t local_130;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  local_128;
  key_type local_f8;
  Settings local_d8;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.forced_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_d8.command_line_options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.rw_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.ro_config._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.ro_config._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"name",(allocator<char> *)&local_f8);
  pvVar1 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&local_d8.command_line_options,(key_type *)local_1b8);
  std::vector<UniValue,std::allocator<UniValue>>::emplace_back<char_const(&)[5]>
            (pvVar1,(char (*) [5])"val1");
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"name",(allocator<char> *)&local_f8);
  pvVar1 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](&local_d8.command_line_options,(key_type *)local_1b8);
  std::vector<UniValue,std::allocator<UniValue>>::emplace_back<char_const(&)[5]>
            (pvVar1,(char (*) [5])"val2");
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b8,"section",&local_1d9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](&local_d8.ro_config,(key_type *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"name",&local_1da);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
            ::operator[](pmVar2,&local_f8);
  local_1d8._M_dataplus._M_p._0_4_ = 2;
  std::vector<UniValue,_std::allocator<UniValue>_>::emplace_back<int>(this_00,(int *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"\"val2\"",(allocator<char> *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"[\"val1\",\"val2\",2]",&local_1d9);
  CheckValues(&local_d8,(string *)local_1b8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_1b8);
  local_1b8._24_8_ = local_1b8 + 8;
  local_1b8._8_4_ = _S_red;
  local_1b8._16_8_ = 0;
  local_190 = 0;
  local_180._M_left = &local_180;
  local_180._M_color = _S_red;
  local_180._M_parent = (_Base_ptr)0x0;
  local_160 = 0;
  local_150._M_left = &local_150;
  local_150._M_color = _S_red;
  local_150._M_parent = (_Base_ptr)0x0;
  local_130 = 0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198 = (_Base_ptr)local_1b8._24_8_;
  local_180._M_right = local_180._M_left;
  local_150._M_right = local_150._M_left;
  local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"section",&local_1d9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](&local_128,&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"name",&local_1da);
  pvVar1 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](pmVar2,&local_1d8);
  std::vector<UniValue,std::allocator<UniValue>>::emplace_back<char_const(&)[5]>
            (pvVar1,(char (*) [5])"val2");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"section",&local_1d9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](&local_128,&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"name",&local_1da);
  pvVar1 = (vector<UniValue,std::allocator<UniValue>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
           ::operator[](pmVar2,&local_1d8);
  std::vector<UniValue,std::allocator<UniValue>>::emplace_back<char_const(&)[5]>
            (pvVar1,(char (*) [5])"val3");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"\"val2\"",&local_1d9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"[\"val2\",\"val3\"]",&local_1da);
  CheckValues((Settings *)local_1b8,&local_f8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_f8);
  common::Settings::~Settings((Settings *)local_1b8);
  common::Settings::~Settings(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(Simple)
{
    common::Settings settings;
    settings.command_line_options["name"].emplace_back("val1");
    settings.command_line_options["name"].emplace_back("val2");
    settings.ro_config["section"]["name"].emplace_back(2);

    // The last given arg takes precedence when specified via commandline.
    CheckValues(settings, R"("val2")", R"(["val1","val2",2])");

    common::Settings settings2;
    settings2.ro_config["section"]["name"].emplace_back("val2");
    settings2.ro_config["section"]["name"].emplace_back("val3");

    // The first given arg takes precedence when specified via config file.
    CheckValues(settings2, R"("val2")", R"(["val2","val3"])");
}